

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

int get_allocate_points(CHAR_DATA *ch)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = 0;
  iVar3 = 0;
  do {
    iVar2 = iVar3 + *(short *)((long)ch->race * 0x88 + 0x493f90 + lVar4 * 2);
    iVar3 = iVar2 + -0xd;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  iVar1 = strcmp(pc_race_table[ch->race].name,"human");
  iVar2 = iVar2 + -0xb;
  if (iVar1 != 0) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

int get_allocate_points(CHAR_DATA *ch)
{
	int allocate = 0, i;

	for (i = STAT_STR; i < MAX_STATS; i++)
	{
		allocate += (pc_race_table[ch->race].max_stats[i] - 13);
	}

	if (!strcmp(pc_race_table[ch->race].name, "human"))
		allocate += 2;

	return allocate;
}